

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

void fsg_model_write_fsm_trans(fsg_model_t *fsg,int i,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  fsg_link_t *pfVar3;
  float64 fVar4;
  char *local_50;
  char *local_48;
  fsg_link_t *tl;
  fsg_arciter_t *itor;
  FILE *fp_local;
  int i_local;
  fsg_model_t *fsg_local;
  
  for (tl = (fsg_link_t *)fsg_model_arcs(fsg,i); tl != (fsg_link_t *)0x0;
      tl = (fsg_link_t *)fsg_arciter_next((fsg_arciter_t *)tl)) {
    pfVar3 = fsg_arciter_get((fsg_arciter_t *)tl);
    uVar1 = pfVar3->from_state;
    uVar2 = pfVar3->to_state;
    if (pfVar3->wid < 0) {
      local_48 = "<eps>";
    }
    else {
      if (pfVar3->wid == -1) {
        local_50 = "(NULL)";
      }
      else {
        local_50 = fsg->vocab[pfVar3->wid];
      }
      local_48 = local_50;
    }
    fVar4 = logmath_log_to_ln(fsg->lmath,(int)((float)pfVar3->logs2prob / (float)fsg->lw));
    fprintf((FILE *)fp,"%d %d %s %f\n",-(double)fVar4,(ulong)uVar1,(ulong)uVar2,local_48);
  }
  return;
}

Assistant:

static void
fsg_model_write_fsm_trans(fsg_model_t * fsg, int i, FILE * fp)
{
    fsg_arciter_t *itor;

    for (itor = fsg_model_arcs(fsg, i); itor;
         itor = fsg_arciter_next(itor)) {
        fsg_link_t *tl = fsg_arciter_get(itor);
        fprintf(fp, "%d %d %s %f\n",
                tl->from_state, tl->to_state,
                (tl->wid < 0) ? "<eps>" : fsg_model_word_str(fsg, tl->wid),
                -logmath_log_to_ln(fsg->lmath, tl->logs2prob / fsg->lw));
    }
}